

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28494c::CAPIBuildSystemFrontendDelegate::commandFinished
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessStatus commandResult)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t
  *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = (this->cAPIDelegate).command_finished;
  if (UNRECOVERED_JUMPTABLE ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)0x0) {
    return;
  }
  if ((uint)commandResult < 4) {
    (*UNRECOVERED_JUMPTABLE)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,commandResult);
    return;
  }
  __assert_fail("0 && \"unknown command result\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0xab,
                "llb_buildsystem_command_result_t (anonymous namespace)::get_command_result(ProcessStatus)"
               );
}

Assistant:

virtual void commandFinished(Command* command, ProcessStatus commandResult) override {
    if (cAPIDelegate.command_finished) {
      cAPIDelegate.command_finished(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          get_command_result(commandResult));
    }
  }